

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

char * GetExpressionTreeNodeName(ExprBase *expression)

{
  ulong uVar1;
  
  uVar1 = (ulong)expression->typeID;
  if ((uVar1 < 0x39) && ((0x1ffffffffffc7ffU >> (uVar1 & 0x3f) & 1) != 0)) {
    return &DAT_001e4f3c + *(int *)(&DAT_001e4f3c + uVar1 * 4);
  }
  __assert_fail("!\"unknown type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x3707,"const char *GetExpressionTreeNodeName(ExprBase *)");
}

Assistant:

const char* GetExpressionTreeNodeName(ExprBase *expression)
{
	switch(expression->typeID)
	{
	case ExprError::myTypeID:
		return "ExprError";
	case ExprErrorTypeMemberAccess::myTypeID:
		return "ExprErrorTypeMemberAccess";
	case ExprVoid::myTypeID:
		return "ExprVoid";
	case ExprBoolLiteral::myTypeID:
		return "ExprBoolLiteral";
	case ExprCharacterLiteral::myTypeID:
		return "ExprCharacterLiteral";
	case ExprStringLiteral::myTypeID:
		return "ExprStringLiteral";
	case ExprIntegerLiteral::myTypeID:
		return "ExprIntegerLiteral";
	case ExprRationalLiteral::myTypeID:
		return "ExprRationalLiteral";
	case ExprTypeLiteral::myTypeID:
		return "ExprTypeLiteral";
	case ExprNullptrLiteral::myTypeID:
		return "ExprNullptrLiteral";
	case ExprFunctionIndexLiteral::myTypeID:
		return "ExprFunctionIndexLiteral";
	case ExprPassthrough::myTypeID:
		return "ExprPassthrough";
	case ExprArray::myTypeID:
		return "ExprArray";
	case ExprPreModify::myTypeID:
		return "ExprPreModify";
	case ExprPostModify::myTypeID:
		return "ExprPostModify";
	case ExprTypeCast::myTypeID:
		return "ExprTypeCast";
	case ExprUnaryOp::myTypeID:
		return "ExprUnaryOp";
	case ExprBinaryOp::myTypeID:
		return "ExprBinaryOp";
	case ExprGetAddress::myTypeID:
		return "ExprGetAddress";
	case ExprDereference::myTypeID:
		return "ExprDereference";
	case ExprUnboxing::myTypeID:
		return "ExprUnboxing";
	case ExprConditional::myTypeID:
		return "ExprConditional";
	case ExprAssignment::myTypeID:
		return "ExprAssignment";
	case ExprMemberAccess::myTypeID:
		return "ExprMemberAccess";
	case ExprArrayIndex::myTypeID:
		return "ExprArrayIndex";
	case ExprReturn::myTypeID:
		return "ExprReturn";
	case ExprYield::myTypeID:
		return "ExprYield";
	case ExprVariableDefinition::myTypeID:
		return "ExprVariableDefinition";
	case ExprZeroInitialize::myTypeID:
		return "ExprZeroInitialize";
	case ExprArraySetup::myTypeID:
		return "ExprArraySetup";
	case ExprVariableDefinitions::myTypeID:
		return "ExprVariableDefinitions";
	case ExprVariableAccess::myTypeID:
		return "ExprVariableAccess";
	case ExprFunctionContextAccess::myTypeID:
		return "ExprFunctionContextAccess";
	case ExprFunctionDefinition::myTypeID:
		return "ExprFunctionDefinition";
	case ExprGenericFunctionPrototype::myTypeID:
		return "ExprGenericFunctionPrototype";
	case ExprFunctionAccess::myTypeID:
		return "ExprFunctionAccess";
	case ExprFunctionOverloadSet::myTypeID:
		return "ExprFunctionOverloadSet";
	case ExprShortFunctionOverloadSet::myTypeID:
		return "ExprShortFunctionOverloadSet";
	case ExprFunctionCall::myTypeID:
		return "ExprFunctionCall";
	case ExprAliasDefinition::myTypeID:
		return "ExprAliasDefinition";
	case ExprClassPrototype::myTypeID:
		return "ExprClassPrototype";
	case ExprGenericClassPrototype::myTypeID:
		return "ExprGenericClassPrototype";
	case ExprClassDefinition::myTypeID:
		return "ExprClassDefinition";
	case ExprEnumDefinition::myTypeID:
		return "ExprEnumDefinition";
	case ExprIfElse::myTypeID:
		return "ExprIfElse";
	case ExprFor::myTypeID:
		return "ExprFor";
	case ExprWhile::myTypeID:
		return "ExprWhile";
	case ExprDoWhile::myTypeID:
		return "ExprDoWhile";
	case ExprSwitch::myTypeID:
		return "ExprSwitch";
	case ExprBreak::myTypeID:
		return "ExprBreak";
	case ExprContinue::myTypeID:
		return "ExprContinue";
	case ExprBlock::myTypeID:
		return "ExprBlock";
	case ExprSequence::myTypeID:
		return "ExprSequence";
	case ExprModule::myTypeID:
		return "ExprModule";
	default:
		break;
	}
	
	assert(!"unknown type");
	return "unknown";
}